

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cpp
# Opt level: O0

ssize_t __thiscall
diffusion::FileReader::read(FileReader *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  reference __x;
  ssize_t extraout_RAX;
  ErrorNoData *this_00;
  undefined4 in_register_00000034;
  vector<char,_std::allocator<char>_> *buffer_local;
  FileReader *this_local;
  
  uVar1 = (**(this->super_Reader)._vptr_Reader)();
  if ((uVar1 & 1) == 0) {
    this_00 = (ErrorNoData *)__cxa_allocate_exception(0x10);
    ErrorNoData::ErrorNoData(this_00);
    __cxa_throw(this_00,&ErrorNoData::typeinfo,ErrorNoData::~ErrorNoData);
  }
  __x = std::
        deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        ::front(&this->data_queue_);
  std::vector<char,_std::allocator<char>_>::operator=
            ((vector<char,_std::allocator<char>_> *)CONCAT44(in_register_00000034,__fd),__x);
  std::
  deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::pop_front(&this->data_queue_);
  return extraout_RAX;
}

Assistant:

void FileReader::read(std::vector<char> &buffer) {
    if (this->can_read()) {
        buffer = data_queue_.front();
        data_queue_.pop_front();
    } else {
        throw ErrorNoData();
    }
}